

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O3

ssh_key * eddsa_new_pub(ssh_keyalg *alg,ptrlen data)

{
  BinarySource *pBVar1;
  ec_curve *curve;
  undefined8 *puVar2;
  EdwardsPoint *pEVar3;
  ptrlen encoded;
  BinarySource src [1];
  BinarySource local_58;
  
  curve = (ec_curve *)(**alg->extra)();
  if (curve->type != EC_EDWARDS) {
    __assert_fail("curve->type == EC_EDWARDS",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                  ,0x295,"ssh_key *eddsa_new_pub(const ssh_keyalg *, ptrlen)");
  }
  local_58.pos = 0;
  local_58.err = BSE_NO_ERROR;
  local_58.data = data.ptr;
  local_58.len = data.len;
  local_58.binarysource_ = &local_58;
  BinarySource_get_string(&local_58);
  puVar2 = (undefined8 *)safemalloc(1,0x20,0);
  pBVar1 = local_58.binarysource_;
  puVar2[3] = alg;
  *puVar2 = curve;
  puVar2[2] = 0;
  encoded = BinarySource_get_string((local_58.binarysource_)->binarysource_);
  if (pBVar1->binarysource_->err == BSE_NO_ERROR) {
    pEVar3 = eddsa_decode(encoded,curve);
    puVar2[1] = pEVar3;
    if (pEVar3 != (EdwardsPoint *)0x0) {
      return (ssh_key *)(puVar2 + 3);
    }
  }
  else {
    puVar2[1] = 0;
  }
  eddsa_freekey((ssh_key *)(puVar2 + 3));
  return (ssh_key *)0x0;
}

Assistant:

static ssh_key *eddsa_new_pub(const ssh_keyalg *alg, ptrlen data)
{
    const struct ecsign_extra *extra =
        (const struct ecsign_extra *)alg->extra;
    struct ec_curve *curve = extra->curve();
    assert(curve->type == EC_EDWARDS);

    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, data);
    get_string(src);

    struct eddsa_key *ek = snew(struct eddsa_key);
    ek->sshk.vt = alg;
    ek->curve = curve;
    ek->privateKey = NULL;

    ek->publicKey = get_epoint(src, curve);
    if (!ek->publicKey) {
        eddsa_freekey(&ek->sshk);
        return NULL;
    }

    return &ek->sshk;
}